

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O2

void verifyTinySVD_4x4<double>(Matrix44<double> *A)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  int i;
  long lVar4;
  Matrix44 *pMVar5;
  double (*padVar6) [4];
  double (*padVar7) [4];
  int j;
  long lVar8;
  int iVar9;
  int j_1;
  double dVar10;
  double local_258;
  Vec4<double> S;
  Matrix44<double> U;
  Matrix44<double> S_times_Vt;
  Matrix44<double> V;
  Matrix44<double> product;
  
  dVar10 = 0.0;
  padVar6 = (double (*) [4])A;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
      dVar3 = ABS((*(double (*) [4])*padVar6)[lVar8]);
      if (dVar3 <= dVar10) {
        dVar3 = dVar10;
      }
      dVar10 = dVar3;
    }
    padVar6 = padVar6 + 1;
  }
  local_258 = dVar10 * 100.0 * 2.220446049250313e-16;
  iVar9 = 0;
  while( true ) {
    if (iVar9 == 2) {
      return;
    }
    U.x[0][0] = 1.0;
    U.x[0][3] = 0.0;
    U.x[1][0] = 0.0;
    U.x[0][1] = 0.0;
    U.x[0][2] = 0.0;
    U.x[1][1] = 1.0;
    U.x[2][0] = 0.0;
    U.x[2][1] = 0.0;
    U.x[1][2] = 0.0;
    U.x[1][3] = 0.0;
    U.x[2][2] = 1.0;
    U.x[3][1] = 0.0;
    U.x[3][2] = 0.0;
    U.x[2][3] = 0.0;
    U.x[3][0] = 0.0;
    U.x[3][3] = 1.0;
    V.x[0][0] = 1.0;
    V.x[0][3] = 0.0;
    V.x[1][0] = 0.0;
    V.x[0][1] = 0.0;
    V.x[0][2] = 0.0;
    V.x[1][1] = 1.0;
    V.x[2][0] = 0.0;
    V.x[2][1] = 0.0;
    V.x[1][2] = 0.0;
    V.x[1][3] = 0.0;
    V.x[2][2] = 1.0;
    V.x[3][1] = 0.0;
    V.x[3][2] = 0.0;
    V.x[2][3] = 0.0;
    V.x[3][0] = 0.0;
    V.x[3][3] = 1.0;
    Imath_3_2::jacobiSVD<double>
              ((Matrix44 *)A,(Matrix44 *)&U,(Vec4 *)&S,(Matrix44 *)&V,2.220446049250313e-16,
               iVar9 == 0);
    S_times_Vt.x[0][0] = 1.0;
    S_times_Vt.x[0][3] = 0.0;
    S_times_Vt.x[1][0] = 0.0;
    S_times_Vt.x[0][1] = 0.0;
    S_times_Vt.x[0][2] = 0.0;
    S_times_Vt.x[1][1] = 1.0;
    S_times_Vt.x[2][0] = 0.0;
    S_times_Vt.x[2][1] = 0.0;
    S_times_Vt.x[1][2] = 0.0;
    S_times_Vt.x[1][3] = 0.0;
    S_times_Vt.x[2][2] = 1.0;
    S_times_Vt.x[3][1] = 0.0;
    S_times_Vt.x[3][2] = 0.0;
    S_times_Vt.x[2][3] = 0.0;
    S_times_Vt.x[3][0] = 0.0;
    S_times_Vt.x[3][3] = 1.0;
    padVar6 = (double (*) [4])&S_times_Vt;
    pMVar5 = (Matrix44 *)&V;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        (*(double (*) [4])*padVar6)[lVar8] =
             *(double *)((long)(U.x + -1) + lVar8 * 8) * *(double *)(pMVar5 + lVar8 * 8);
      }
      padVar6 = padVar6 + 1;
      pMVar5 = pMVar5 + 0x20;
    }
    Imath_3_2::Matrix44<double>::transpose(&S_times_Vt);
    padVar6 = (double (*) [4])&product;
    Imath_3_2::Matrix44<double>::multiply(&U,&S_times_Vt);
    padVar7 = (double (*) [4])A;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      lVar8 = 0;
      while (lVar8 != 4) {
        pdVar2 = *(double (*) [4])*padVar6 + lVar8;
        pdVar1 = *(double (*) [4])*padVar7 + lVar8;
        lVar8 = lVar8 + 1;
        if (local_258 < ABS(*pdVar2 - *pdVar1)) {
          __assert_fail("std::abs (product[i][j] - A[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x8b,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]")
          ;
        }
      }
      padVar7 = padVar7 + 1;
      padVar6 = padVar6 + 1;
    }
    if (iVar9 == 0) {
      dVar10 = Imath_3_2::Matrix44<double>::determinant(&U);
      if (dVar10 <= 0.99) {
        __assert_fail("U.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x90,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
      dVar10 = Imath_3_2::Matrix44<double>::determinant(&V);
      if (dVar10 <= 0.99) {
        __assert_fail("V.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x91,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
    }
    lVar4 = 1;
    while (lVar4 != 4) {
      pdVar1 = &local_258 + lVar4;
      lVar8 = lVar4 * 8;
      lVar4 = lVar4 + 1;
      if (*pdVar1 < *(double *)((long)(U.x + -1) + lVar8)) {
        __assert_fail("S[i] >= S[i + 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x96,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
    }
    lVar4 = 0;
    while (lVar4 != 3) {
      lVar8 = lVar4 * 8;
      lVar4 = lVar4 + 1;
      if (*(double *)((long)(U.x + -1) + lVar8) < 0.0) {
        __assert_fail("S[i] >= T (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x9a,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
    }
    if ((iVar9 != 0) && (S.w < 0.0)) break;
    verifyOrthonormal<double>(&U);
    verifyOrthonormal<double>(&V);
    iVar9 = iVar9 + 1;
  }
  __assert_fail("S[3] >= T (0)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                ,0x9c,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
}

Assistant:

void
verifyTinySVD_4x4 (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (100) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec4<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix44<T> product = U * S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V have positive determinant if requested:
        if (posDet)
        {
            assert (U.determinant () > 0.99);
            assert (V.determinant () > 0.99);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[3] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}